

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

_Bool unshield_reader_open_volume(UnshieldReader *reader,int volume)

{
  uint16_t *puVar1;
  Unshield *pUVar2;
  Header *pHVar3;
  FileDescriptor *pFVar4;
  _Bool _Var5;
  ushort uVar6;
  FILE *pFVar7;
  size_t sVar8;
  long lVar9;
  char *format;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint32_t *puVar14;
  uint64_t uVar15;
  uint8_t tmp [20];
  uint32_t local_74;
  uint32_t local_70;
  uint32_t local_6c;
  uint32_t local_68;
  uint32_t uStack_64;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint8_t *p;
  CommonHeader common_header;
  
  _unshield_log(3,"unshield_reader_open_volume",0x13b,"Open volume %i",volume);
  if (reader->volume_file != (FILE *)0x0) {
    (*reader->unshield->io_callbacks->fclose)(reader->volume_file,reader->unshield->io_userdata);
    reader->volume_file = (FILE *)0x0;
  }
  pFVar7 = unshield_fopen_for_reading(reader->unshield,volume,"cab");
  reader->volume_file = pFVar7;
  if (pFVar7 == (FILE *)0x0) {
    _unshield_log(1,"unshield_reader_open_volume",0x143,"Failed to open input cabinet file %i",
                  volume);
    return false;
  }
  p = tmp;
  sVar8 = (*reader->unshield->io_callbacks->fread)(tmp,1,0x14,pFVar7,reader->unshield->io_userdata);
  if ((sVar8 != 0x14) || (_Var5 = unshield_read_common_header(&p,&common_header), !_Var5)) {
    return false;
  }
  (reader->volume_header).last_file_size_expanded = 0;
  (reader->volume_header).last_file_size_expanded_high = 0;
  (reader->volume_header).last_file_size_compressed = 0;
  (reader->volume_header).last_file_size_compressed_high = 0;
  (reader->volume_header).first_file_size_compressed = 0;
  (reader->volume_header).first_file_size_compressed_high = 0;
  (reader->volume_header).last_file_offset = 0;
  (reader->volume_header).last_file_offset_high = 0;
  (reader->volume_header).first_file_offset = 0;
  (reader->volume_header).first_file_offset_high = 0;
  (reader->volume_header).first_file_size_expanded = 0;
  (reader->volume_header).first_file_size_expanded_high = 0;
  (reader->volume_header).data_offset = 0;
  (reader->volume_header).data_offset_high = 0;
  (reader->volume_header).first_file_index = 0;
  (reader->volume_header).last_file_index = 0;
  pUVar2 = reader->unshield;
  iVar10 = pUVar2->header_list->major_version;
  if ((iVar10 == 5) || (iVar10 == 0)) {
    sVar8 = (*pUVar2->io_callbacks->fread)(tmp,1,0x28,reader->volume_file,pUVar2->io_userdata);
    if (sVar8 != 0x28) {
      return false;
    }
    (reader->volume_header).data_offset = tmp._0_4_;
    if (tmp._4_4_ != 0) {
      _unshield_log(3,"unshield_reader_open_volume",0x163,"Unknown = %08x");
    }
    (reader->volume_header).first_file_index = tmp._8_4_;
    (reader->volume_header).last_file_index = tmp._12_4_;
    (reader->volume_header).first_file_offset = tmp._16_4_;
    (reader->volume_header).first_file_size_expanded = local_74;
    (reader->volume_header).first_file_size_compressed = local_70;
    (reader->volume_header).last_file_offset = local_6c;
    (reader->volume_header).last_file_size_expanded = local_68;
    (reader->volume_header).last_file_size_compressed = uStack_64;
    if (local_6c == 0) {
      (reader->volume_header).last_file_offset = 0x7fffffff;
    }
  }
  else {
    sVar8 = (*pUVar2->io_callbacks->fread)(tmp,1,0x40,reader->volume_file,pUVar2->io_userdata);
    if (sVar8 != 0x40) {
      return false;
    }
    (reader->volume_header).data_offset = tmp._0_4_;
    (reader->volume_header).data_offset_high = tmp._4_4_;
    (reader->volume_header).first_file_index = tmp._8_4_;
    (reader->volume_header).last_file_index = tmp._12_4_;
    (reader->volume_header).first_file_offset = tmp._16_4_;
    (reader->volume_header).first_file_offset_high = local_74;
    (reader->volume_header).first_file_size_expanded = local_70;
    (reader->volume_header).first_file_size_expanded_high = local_6c;
    (reader->volume_header).first_file_size_compressed = local_68;
    (reader->volume_header).first_file_size_compressed_high = uStack_64;
    (reader->volume_header).last_file_offset = (undefined4)uStack_60;
    (reader->volume_header).last_file_offset_high = uStack_60._4_4_;
    (reader->volume_header).last_file_size_expanded = (undefined4)local_58;
    (reader->volume_header).last_file_size_expanded_high = local_58._4_4_;
    (reader->volume_header).last_file_size_compressed = (undefined4)uStack_50;
    (reader->volume_header).last_file_size_compressed_high = uStack_50._4_4_;
  }
  _unshield_log(3,"unshield_reader_open_volume",0x19b,"First file index = %i, last file index = %i",
                (ulong)(uint)tmp._8_4_,(ulong)(uint)tmp._12_4_);
  _unshield_log(3,"unshield_reader_open_volume",0x19d,
                "First file offset = %08x, last file offset = %08x",
                (ulong)(reader->volume_header).first_file_offset,
                (ulong)(reader->volume_header).last_file_offset);
  pHVar3 = reader->unshield->header_list;
  if (pHVar3->major_version == 5) {
    uVar11 = reader->index;
    if (((uVar11 < (pHVar3->cab).file_count - 1) &&
        (uVar11 == (reader->volume_header).last_file_index)) &&
       (reader->file_descriptor->compressed_size !=
        (ulong)(reader->volume_header).last_file_size_compressed)) {
      format = "IS5 split file last in volume";
      iVar10 = 0x1a7;
    }
    else {
      if (((uVar11 == 0) || (uVar11 != (reader->volume_header).first_file_index)) ||
         (reader->file_descriptor->compressed_size ==
          (ulong)(reader->volume_header).first_file_size_compressed)) goto LAB_00104638;
      format = "IS5 split file first in volume";
      iVar10 = 0x1ae;
    }
    _unshield_log(3,"unshield_reader_open_volume",iVar10,format);
    puVar1 = &reader->file_descriptor->flags;
    *puVar1 = *puVar1 | 1;
  }
LAB_00104638:
  pFVar4 = reader->file_descriptor;
  uVar6 = pFVar4->flags;
  if ((uVar6 & 1) == 0) {
    uVar15 = pFVar4->data_offset;
    uVar11 = (uint)pFVar4->expanded_size;
    uVar12 = (uint)pFVar4->compressed_size;
  }
  else {
    _unshield_log(3,"unshield_reader_open_volume",0x1b7,"previous data offset = 0x08%x",0);
    uVar11 = reader->index;
    if ((uVar11 == (reader->volume_header).last_file_index) &&
       (puVar14 = &(reader->volume_header).last_file_offset, *puVar14 != 0x7fffffff)) {
      _unshield_log(3,"unshield_reader_open_volume",0x1bf,"Index %i is last file in cabinet file %i"
                    ,(ulong)uVar11,volume);
      lVar9 = 0x60;
      lVar13 = 0x58;
    }
    else {
      if (uVar11 != (reader->volume_header).first_file_index) {
        return true;
      }
      lVar13 = 0x40;
      puVar14 = &(reader->volume_header).first_file_offset;
      _unshield_log(3,"unshield_reader_open_volume",0x1ca,
                    "Index %i is first file in cabinet file %i",(ulong)uVar11,volume);
      lVar9 = 0x48;
    }
    uVar11 = *(uint *)((long)&reader->unshield + lVar13);
    uVar12 = *(uint *)((long)&reader->unshield + lVar9);
    uVar15 = (uint64_t)*puVar14;
    _unshield_log(3,"unshield_reader_open_volume",0x1d9,"Will read 0x%08x bytes from offset 0x%08x",
                  (ulong)uVar12,uVar15);
    uVar6 = reader->file_descriptor->flags;
  }
  if ((uVar6 & 4) == 0) {
    uVar12 = uVar11;
  }
  reader->volume_bytes_left = uVar12;
  (*reader->unshield->io_callbacks->fseek)
            (reader->volume_file,uVar15,0,reader->unshield->io_userdata);
  reader->volume = volume;
  return true;
}

Assistant:

static bool unshield_reader_open_volume(UnshieldReader* reader, int volume)/*{{{*/
{
  bool success = false;
  uint64_t data_offset = 0;
  uint64_t volume_bytes_left_compressed;
  uint64_t volume_bytes_left_expanded;
  CommonHeader common_header;

#if VERBOSE >= 2
  unshield_trace("Open volume %i", volume);
#endif

  FCLOSE(reader->unshield, reader->volume_file);

  reader->volume_file = unshield_fopen_for_reading(reader->unshield, volume, CABINET_SUFFIX);
  if (!reader->volume_file)
  {
    unshield_error("Failed to open input cabinet file %i", volume);
    goto exit;
  }

  {
    uint8_t tmp[COMMON_HEADER_SIZE];
    uint8_t* p = tmp;

    if (COMMON_HEADER_SIZE != unshield_fread(reader->unshield, &tmp, 1, COMMON_HEADER_SIZE, reader->volume_file))
      goto exit;

    if (!unshield_read_common_header(&p, &common_header))
      goto exit;
  }
 
  memset(&reader->volume_header, 0, sizeof(VolumeHeader));

  switch (reader->unshield->header_list->major_version)
  {
    case 0:
    case 5:
      {
        uint8_t five_header[VOLUME_HEADER_SIZE_V5];
        uint8_t* p = five_header;

        if (VOLUME_HEADER_SIZE_V5 !=
            unshield_fread(reader->unshield, &five_header, 1, VOLUME_HEADER_SIZE_V5, reader->volume_file))
          goto exit;

        reader->volume_header.data_offset                = READ_UINT32(p); p += 4;
#if VERBOSE
        if (READ_UINT32(p))
          unshield_trace("Unknown = %08x", READ_UINT32(p));
#endif
        /* unknown */                                                      p += 4;
        reader->volume_header.first_file_index           = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_index            = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_offset          = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_expanded   = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_compressed = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_offset           = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_expanded    = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_compressed  = READ_UINT32(p); p += 4;

        if (reader->volume_header.last_file_offset == 0)
          reader->volume_header.last_file_offset = INT32_MAX;
      }
      break;

    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 11:
    case 12:
    case 13:
    default:
      {
        uint8_t six_header[VOLUME_HEADER_SIZE_V6];
        uint8_t* p = six_header;

        if (VOLUME_HEADER_SIZE_V6 !=
            unshield_fread(reader->unshield, &six_header, 1, VOLUME_HEADER_SIZE_V6, reader->volume_file))
          goto exit;

        reader->volume_header.data_offset                       = READ_UINT32(p); p += 4;
        reader->volume_header.data_offset_high                  = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_index                  = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_index                   = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_offset                 = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_offset_high            = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_expanded          = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_expanded_high     = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_compressed        = READ_UINT32(p); p += 4;
        reader->volume_header.first_file_size_compressed_high   = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_offset                  = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_offset_high             = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_expanded           = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_expanded_high      = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_compressed         = READ_UINT32(p); p += 4;
        reader->volume_header.last_file_size_compressed_high    = READ_UINT32(p); p += 4;
      }
      break;
  }
  
#if VERBOSE >= 2
  unshield_trace("First file index = %i, last file index = %i",
      reader->volume_header.first_file_index, reader->volume_header.last_file_index);
  unshield_trace("First file offset = %08x, last file offset = %08x",
      reader->volume_header.first_file_offset, reader->volume_header.last_file_offset);
#endif

  /* enable support for split archives for IS5 */
  if (reader->unshield->header_list->major_version == 5)
  {
    if (reader->index < (reader->unshield->header_list->cab.file_count - 1) &&
        reader->index == reader->volume_header.last_file_index && 
        reader->volume_header.last_file_size_compressed != reader->file_descriptor->compressed_size)
    {
      unshield_trace("IS5 split file last in volume");
      reader->file_descriptor->flags |= FILE_SPLIT;
    }
    else if (reader->index > 0 &&
        reader->index == reader->volume_header.first_file_index && 
        reader->volume_header.first_file_size_compressed != reader->file_descriptor->compressed_size)
    {
      unshield_trace("IS5 split file first in volume");
      reader->file_descriptor->flags |= FILE_SPLIT;
    }
  }

  if (reader->file_descriptor->flags & FILE_SPLIT)
  {   
#if VERBOSE
    unshield_trace(/*"Total bytes left = 0x08%x, "*/"previous data offset = 0x08%x",
        /*total_bytes_left, */data_offset); 
#endif

    if (reader->index == reader->volume_header.last_file_index && reader->volume_header.last_file_offset != 0x7FFFFFFF)
    {
      /* can be first file too... */
#if VERBOSE
      unshield_trace("Index %i is last file in cabinet file %i",
          reader->index, volume);
#endif

      data_offset                   = reader->volume_header.last_file_offset;
      volume_bytes_left_expanded    = reader->volume_header.last_file_size_expanded;
      volume_bytes_left_compressed  = reader->volume_header.last_file_size_compressed;
    }
    else if (reader->index == reader->volume_header.first_file_index)
    {
#if VERBOSE
      unshield_trace("Index %i is first file in cabinet file %i",
          reader->index, volume);
#endif

      data_offset                   = reader->volume_header.first_file_offset;
      volume_bytes_left_expanded    = reader->volume_header.first_file_size_expanded;
      volume_bytes_left_compressed  = reader->volume_header.first_file_size_compressed;
    }
    else
    {
      success = true;
      goto exit;
    }

#if VERBOSE
    unshield_trace("Will read 0x%08x bytes from offset 0x%08x",
        volume_bytes_left_compressed, data_offset);
#endif
  }
  else
  {
    data_offset                  = reader->file_descriptor->data_offset;
    volume_bytes_left_expanded   = reader->file_descriptor->expanded_size;
    volume_bytes_left_compressed = reader->file_descriptor->compressed_size;
  }

  if (reader->file_descriptor->flags & FILE_COMPRESSED)
    reader->volume_bytes_left = volume_bytes_left_compressed;
  else
    reader->volume_bytes_left = volume_bytes_left_expanded;

  unshield_fseek(reader->unshield, reader->volume_file, data_offset, SEEK_SET);

  reader->volume = volume;
  success = true;

exit:
  return success;
}